

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# groupnorm_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::GroupNorm_x86_avx::forward_inplace(GroupNorm_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  undefined1 (*pauVar25) [32];
  float *pfVar26;
  long lVar27;
  uint uVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  float *pfVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  __m128 x64;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar94 [16];
  undefined1 auVar103 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar104 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar135;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar152 [64];
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar153 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar172 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar151 [32];
  undefined1 auVar171 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  
  auVar16 = _DAT_005f1c20;
  auVar15 = _DAT_005f1c00;
  iVar20 = bottom_top_blob->dims;
  uVar32 = (long)(this->super_GroupNorm).channels / (long)(this->super_GroupNorm).group;
  uVar36 = uVar32 & 0xffffffff;
  uVar18 = (uint)uVar32;
  auVar120 = in_ZMM6._0_16_;
  if (iVar20 == 2) {
    if (0 < (this->super_GroupNorm).group) {
      uVar19 = bottom_top_blob->w;
      uVar28 = uVar19 * uVar18;
      uVar21 = uVar28 & 0xfffffff8;
      lVar27 = 0;
      auVar46._8_8_ = 0x8000000000000000;
      auVar46._0_8_ = 0x8000000000000000;
      auVar120 = vpcmpeqd_avx(auVar120,auVar120);
      do {
        lVar30 = lVar27 * (int)uVar18;
        pauVar29 = (undefined1 (*) [32])
                   (bottom_top_blob->w * lVar30 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        fVar141 = 0.0;
        fVar142 = 0.0;
        fVar135 = 0.0;
        fVar140 = 0.0;
        fVar143 = 0.0;
        fVar144 = 0.0;
        fVar145 = 0.0;
        fVar146 = 0.0;
        pauVar25 = pauVar29;
        uVar23 = 0;
        fVar154 = 0.0;
        fVar155 = 0.0;
        fVar156 = 0.0;
        fVar157 = 0.0;
        fVar158 = 0.0;
        fVar159 = 0.0;
        fVar160 = 0.0;
        fVar161 = 0.0;
        if (7 < (int)uVar28) {
          iVar20 = 7;
          do {
            fVar135 = fVar135 + *(float *)*pauVar25;
            fVar140 = fVar140 + *(float *)(*pauVar25 + 4);
            fVar141 = fVar141 + *(float *)(*pauVar25 + 8);
            fVar142 = fVar142 + *(float *)(*pauVar25 + 0xc);
            fVar143 = fVar143 + *(float *)(*pauVar25 + 0x10);
            fVar144 = fVar144 + *(float *)(*pauVar25 + 0x14);
            fVar145 = fVar145 + *(float *)(*pauVar25 + 0x18);
            fVar146 = fVar146 + *(float *)(*pauVar25 + 0x1c);
            pauVar25 = pauVar25 + 1;
            iVar20 = iVar20 + 8;
            uVar23 = uVar21;
            fVar154 = fVar135;
            fVar155 = fVar140;
            fVar156 = fVar141;
            fVar157 = fVar142;
            fVar158 = fVar143;
            fVar159 = fVar144;
            fVar160 = fVar145;
            fVar161 = fVar146;
          } while (iVar20 < (int)uVar28);
        }
        uVar22 = uVar23 | 3;
        auVar58 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar141 = auVar58._4_4_;
          fVar142 = auVar58._8_4_;
          fVar135 = auVar58._12_4_;
          if ((int)uVar28 <= (int)uVar22) break;
          auVar58._0_4_ = auVar58._0_4_ + *(float *)*pauVar25;
          auVar58._4_4_ = fVar141 + *(float *)(*pauVar25 + 4);
          auVar58._8_4_ = fVar142 + *(float *)(*pauVar25 + 8);
          auVar58._12_4_ = fVar135 + *(float *)(*pauVar25 + 0xc);
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar50._0_4_ = fVar154 + fVar158;
        auVar50._4_4_ = fVar155 + fVar159;
        auVar50._8_4_ = fVar156 + fVar160;
        auVar50._12_4_ = fVar157 + fVar161;
        auVar52 = vshufpd_avx(auVar50,auVar50,1);
        auVar51._0_4_ = auVar52._0_4_ + auVar50._0_4_;
        auVar51._4_4_ = auVar52._4_4_ + auVar50._4_4_;
        auVar51._8_4_ = auVar52._8_4_ + auVar50._8_4_;
        auVar51._12_4_ = auVar52._12_4_ + auVar50._12_4_;
        auVar52 = vshufpd_avx(auVar58,auVar58,1);
        auVar109._0_4_ = auVar58._0_4_ + auVar52._0_4_;
        auVar109._4_4_ = fVar141 + auVar52._4_4_;
        auVar109._8_4_ = fVar142 + auVar52._8_4_;
        auVar109._12_4_ = fVar135 + auVar52._12_4_;
        auVar58 = vhaddps_avx(auVar51,auVar51);
        auVar52 = vmovshdup_avx(auVar109);
        fVar141 = auVar58._0_4_ + auVar52._0_4_ + auVar109._0_4_;
        if ((int)uVar23 < (int)uVar28) {
          uVar32 = CONCAT44(0,~uVar23 + uVar28);
          auVar58 = vblendps_avx(ZEXT416((uint)fVar141),_DAT_005f00d0,0xe);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = uVar32;
          auVar51 = vpshufd_avx(auVar52,0x44);
          auVar52 = vorps_avx(auVar51,auVar46);
          auVar50 = vorps_avx(auVar51,auVar46);
          uVar36 = 0;
          auVar152 = ZEXT1664(auVar58);
          do {
            auVar172 = auVar152;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar36;
            auVar58 = vpshufd_avx(auVar53,0x44);
            auVar80._16_16_ = auVar58;
            auVar80._0_16_ = auVar58;
            auVar81 = vorps_avx(auVar80,auVar15);
            auVar80 = vorps_avx(auVar80,auVar16);
            auVar58 = vorps_avx(auVar51,auVar46);
            auVar126._8_4_ = auVar80._24_4_;
            auVar126._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
            auVar126._12_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar126,auVar58);
            auVar110._8_4_ = auVar80._8_4_;
            auVar174._8_4_ = auVar110._8_4_;
            auVar174._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar174._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar109 = vpcmpgtq_avx(auVar174,auVar52);
            auVar109 = vpackssdw_avx(auVar109,auVar53);
            auVar180._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
            auVar180._8_4_ = auVar81._24_4_;
            auVar180._12_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar180,auVar58);
            auVar181._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar181._8_4_ = auVar81._8_4_;
            auVar181._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar181,auVar50);
            auVar58 = vpackssdw_avx(auVar58,auVar126);
            auVar58 = vpackssdw_avx(auVar58 ^ auVar120,auVar109 ^ auVar120);
            auVar109 = vpmovsxwd_avx(auVar58);
            auVar58 = vpunpckhwd_avx(auVar58,auVar58);
            auVar177._16_16_ = auVar58;
            auVar177._0_16_ = auVar109;
            auVar177 = vmaskmovps_avx(auVar177,*(undefined1 (*) [32])(*pauVar25 + uVar36 * 4));
            auVar137._0_4_ = auVar177._0_4_ + auVar172._0_4_;
            auVar137._4_4_ = auVar177._4_4_ + auVar172._4_4_;
            auVar137._8_4_ = auVar177._8_4_ + auVar172._8_4_;
            auVar137._12_4_ = auVar177._12_4_ + auVar172._12_4_;
            auVar139._16_4_ = auVar177._16_4_ + auVar172._16_4_;
            auVar139._0_16_ = auVar137;
            auVar139._20_4_ = auVar177._20_4_ + auVar172._20_4_;
            auVar139._24_4_ = auVar177._24_4_ + auVar172._24_4_;
            auVar139._28_4_ = auVar177._28_4_ + auVar172._28_4_;
            uVar36 = uVar36 + 8;
            auVar152 = ZEXT3264(auVar139);
          } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          auVar58 = vorps_avx(auVar51,auVar46);
          auVar110._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
          auVar110._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar110,auVar58);
          auVar52 = vpackssdw_avx(auVar58,auVar53);
          auVar58 = vorps_avx(auVar51,auVar46);
          auVar149._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
          auVar149._8_4_ = auVar81._8_4_;
          auVar149._12_4_ = auVar81._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar149,auVar58);
          auVar58 = vpackssdw_avx(auVar58,auVar126);
          auVar58 = vblendvps_avx(auVar172._0_16_,auVar137,auVar58 ^ auVar120);
          auVar52 = vblendvps_avx(auVar172._16_16_,auVar139._16_16_,auVar52 ^ auVar120);
          auVar58 = vhaddps_avx(auVar52,auVar58);
          auVar58 = vhaddps_avx(auVar58,auVar58);
          auVar58 = vhaddps_avx(auVar58,auVar58);
          fVar141 = auVar58._0_4_;
        }
        fVar141 = (1.0 / (float)(int)uVar28) * fVar141;
        auVar58 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
        pauVar25 = pauVar29;
        if ((int)uVar28 < 8) {
          fVar142 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          uVar23 = 0;
        }
        else {
          auVar81._16_16_ = auVar58;
          auVar81._0_16_ = auVar58;
          fVar142 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          iVar20 = 7;
          do {
            auVar80 = vsubps_avx(*pauVar25,auVar81);
            fVar142 = fVar142 + auVar80._0_4_ * auVar80._0_4_;
            fVar154 = fVar154 + auVar80._4_4_ * auVar80._4_4_;
            fVar155 = fVar155 + auVar80._8_4_ * auVar80._8_4_;
            fVar156 = fVar156 + auVar80._12_4_ * auVar80._12_4_;
            fVar157 = fVar157 + auVar80._16_4_ * auVar80._16_4_;
            fVar158 = fVar158 + auVar80._20_4_ * auVar80._20_4_;
            fVar159 = fVar159 + auVar80._24_4_ * auVar80._24_4_;
            fVar160 = fVar160 + auVar80._28_4_;
            pauVar25 = pauVar25 + 1;
            iVar20 = iVar20 + 8;
            uVar23 = uVar21;
          } while (iVar20 < (int)uVar28);
        }
        uVar22 = uVar23 | 3;
        auVar163 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar161 = auVar163._4_4_;
          fVar135 = auVar163._8_4_;
          fVar140 = auVar163._12_4_;
          if ((int)uVar28 <= (int)uVar22) break;
          auVar52 = vsubps_avx(*(undefined1 (*) [16])*pauVar25,auVar58);
          auVar163._0_4_ = auVar163._0_4_ + auVar52._0_4_ * auVar52._0_4_;
          auVar163._4_4_ = fVar161 + auVar52._4_4_ * auVar52._4_4_;
          auVar163._8_4_ = fVar135 + auVar52._8_4_ * auVar52._8_4_;
          auVar163._12_4_ = fVar140 + auVar52._12_4_ * auVar52._12_4_;
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          uVar22 = uVar23 + 7;
          uVar23 = uVar23 + 4;
        }
        auVar54._0_4_ = fVar142 + fVar157;
        auVar54._4_4_ = fVar154 + fVar158;
        auVar54._8_4_ = fVar155 + fVar159;
        auVar54._12_4_ = fVar156 + fVar160;
        auVar52 = vshufpd_avx(auVar54,auVar54,1);
        auVar55._0_4_ = auVar52._0_4_ + auVar54._0_4_;
        auVar55._4_4_ = auVar52._4_4_ + auVar54._4_4_;
        auVar55._8_4_ = auVar52._8_4_ + auVar54._8_4_;
        auVar55._12_4_ = auVar52._12_4_ + auVar54._12_4_;
        auVar52 = vshufpd_avx(auVar163,auVar163,1);
        auVar111._0_4_ = auVar163._0_4_ + auVar52._0_4_;
        auVar111._4_4_ = fVar161 + auVar52._4_4_;
        auVar111._8_4_ = fVar135 + auVar52._8_4_;
        auVar111._12_4_ = fVar140 + auVar52._12_4_;
        auVar52 = vhaddps_avx(auVar55,auVar55);
        auVar50 = vmovshdup_avx(auVar111);
        fVar142 = auVar52._0_4_ + auVar50._0_4_ + auVar111._0_4_;
        if ((int)uVar23 < (int)uVar28) {
          uVar32 = CONCAT44(0,~uVar23 + uVar28);
          auVar52 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_005f00d0,0xe);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = uVar32;
          auVar51 = vpshufd_avx(auVar56,0x44);
          auVar166._16_16_ = auVar58;
          auVar166._0_16_ = auVar58;
          auVar58 = vorps_avx(auVar51,auVar46);
          auVar50 = vorps_avx(auVar51,auVar46);
          uVar36 = 0;
          auVar152 = ZEXT1664(auVar52);
          do {
            auVar172 = auVar152;
            auVar57._8_8_ = 0;
            auVar57._0_8_ = uVar36;
            auVar52 = vpshufd_avx(auVar57,0x44);
            auVar82._16_16_ = auVar52;
            auVar82._0_16_ = auVar52;
            auVar81 = vorps_avx(auVar82,auVar15);
            auVar80 = vorps_avx(auVar82,auVar16);
            auVar52 = vorps_avx(auVar51,auVar46);
            auVar127._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
            auVar127._8_4_ = auVar80._24_4_;
            auVar127._12_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar127,auVar52);
            auVar186._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar112._8_4_ = auVar80._8_4_;
            auVar186._8_4_ = auVar112._8_4_;
            auVar186._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar109 = vpcmpgtq_avx(auVar186,auVar58);
            auVar109 = vpackssdw_avx(auVar109,auVar53);
            auVar92._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
            auVar92._8_4_ = auVar81._24_4_;
            auVar92._12_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar126 = vpcmpgtq_avx(auVar92,auVar52);
            auVar93._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar93._8_4_ = auVar81._8_4_;
            auVar93._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar52 = vpcmpgtq_avx(auVar93,auVar50);
            auVar52 = vpackssdw_avx(auVar52,auVar126);
            auVar52 = vpackssdw_avx(auVar52 ^ auVar120,auVar109 ^ auVar120);
            auVar109 = vpmovsxwd_avx(auVar52);
            auVar52 = vpunpckhwd_avx(auVar52,auVar52);
            auVar100._16_16_ = auVar52;
            auVar100._0_16_ = auVar109;
            auVar177 = vmaskmovps_avx(auVar100,*(undefined1 (*) [32])(*pauVar25 + uVar36 * 4));
            auVar177 = vsubps_avx(auVar177,auVar166);
            auVar187._0_4_ = auVar172._0_4_ + auVar177._0_4_ * auVar177._0_4_;
            auVar187._4_4_ = auVar172._4_4_ + auVar177._4_4_ * auVar177._4_4_;
            auVar187._8_4_ = auVar172._8_4_ + auVar177._8_4_ * auVar177._8_4_;
            auVar187._12_4_ = auVar172._12_4_ + auVar177._12_4_ * auVar177._12_4_;
            auVar191._16_4_ = auVar172._16_4_ + auVar177._16_4_ * auVar177._16_4_;
            auVar191._0_16_ = auVar187;
            auVar191._20_4_ = auVar172._20_4_ + auVar177._20_4_ * auVar177._20_4_;
            auVar191._24_4_ = auVar172._24_4_ + auVar177._24_4_ * auVar177._24_4_;
            auVar191._28_4_ = auVar172._28_4_ + auVar177._28_4_;
            uVar36 = uVar36 + 8;
            auVar152 = ZEXT3264(auVar191);
          } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          auVar58 = vorps_avx(auVar51,auVar46);
          auVar112._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
          auVar112._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar112,auVar58);
          auVar52 = vpackssdw_avx(auVar58,auVar53);
          auVar58 = vorps_avx(auVar51,auVar46);
          auVar128._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
          auVar128._8_4_ = auVar81._8_4_;
          auVar128._12_4_ = auVar81._12_4_ ^ 0x80000000;
          auVar58 = vpcmpgtq_avx(auVar128,auVar58);
          auVar58 = vpackssdw_avx(auVar58,auVar126);
          auVar58 = vblendvps_avx(auVar172._0_16_,auVar187,auVar58 ^ auVar120);
          auVar52 = vblendvps_avx(auVar172._16_16_,auVar191._16_16_,auVar52 ^ auVar120);
          in_ZMM1 = ZEXT1664(auVar52);
          auVar58 = vhaddps_avx(auVar52,auVar58);
          auVar58 = vhaddps_avx(auVar58,auVar58);
          auVar58 = vhaddps_avx(auVar58,auVar58);
          fVar142 = auVar58._0_4_;
        }
        auVar58 = ZEXT416((uint)((1.0 / (float)(int)uVar28) * fVar142 + (this->super_GroupNorm).eps)
                         );
        auVar58 = vsqrtss_avx(auVar58,auVar58);
        fVar142 = 1.0 / auVar58._0_4_;
        fVar141 = fVar142 * -fVar141;
        if ((this->super_GroupNorm).affine == 0) {
          auVar58 = vshufps_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),0);
          auVar52 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
          fVar141 = auVar52._0_4_;
          fVar142 = auVar52._4_4_;
          fVar154 = auVar52._8_4_;
          fVar155 = auVar52._12_4_;
          fVar156 = auVar58._0_4_;
          fVar157 = auVar58._4_4_;
          fVar158 = auVar58._8_4_;
          fVar159 = auVar58._12_4_;
          uVar23 = 0;
          if (7 < (int)uVar28) {
            iVar20 = 7;
            do {
              auVar102._0_4_ = fVar156 * *(float *)*pauVar29 + fVar141;
              auVar102._4_4_ = fVar157 * *(float *)(*pauVar29 + 4) + fVar142;
              auVar102._8_4_ = fVar158 * *(float *)(*pauVar29 + 8) + fVar154;
              auVar102._12_4_ = fVar159 * *(float *)(*pauVar29 + 0xc) + fVar155;
              auVar102._16_4_ = fVar156 * *(float *)(*pauVar29 + 0x10) + fVar141;
              auVar102._20_4_ = fVar157 * *(float *)(*pauVar29 + 0x14) + fVar142;
              auVar102._24_4_ = fVar158 * *(float *)(*pauVar29 + 0x18) + fVar154;
              auVar102._28_4_ = in_ZMM1._28_4_ + fVar155;
              in_ZMM1 = ZEXT3264(auVar102);
              *pauVar29 = auVar102;
              pauVar29 = pauVar29 + 1;
              iVar20 = iVar20 + 8;
              uVar23 = uVar21;
            } while (iVar20 < (int)uVar28);
          }
          uVar22 = uVar23 | 3;
          while ((int)uVar22 < (int)uVar28) {
            fVar160 = *(float *)(*pauVar29 + 4);
            fVar161 = *(float *)(*pauVar29 + 8);
            fVar135 = *(float *)(*pauVar29 + 0xc);
            *(float *)*pauVar29 = fVar141 + fVar156 * *(float *)*pauVar29;
            *(float *)(*pauVar29 + 4) = fVar142 + fVar157 * fVar160;
            *(float *)(*pauVar29 + 8) = fVar154 + fVar158 * fVar161;
            *(float *)(*pauVar29 + 0xc) = fVar155 + fVar159 * fVar135;
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar22 = uVar23 + 7;
            uVar23 = uVar23 + 4;
          }
          if ((int)uVar23 < (int)uVar28) {
            uVar32 = CONCAT44(0,~uVar23 + uVar28);
            auVar59._8_8_ = 0;
            auVar59._0_8_ = uVar32;
            auVar50 = vpshufd_avx(auVar59,0x44);
            auVar58 = vorps_avx(auVar50,auVar46);
            auVar52 = vorps_avx(auVar50,auVar46);
            uVar36 = 0;
            do {
              auVar60._8_8_ = 0;
              auVar60._0_8_ = uVar36;
              auVar51 = vpshufd_avx(auVar60,0x44);
              auVar83._16_16_ = auVar51;
              auVar83._0_16_ = auVar51;
              auVar81 = vorps_avx(auVar83,auVar15);
              auVar80 = vorps_avx(auVar83,auVar16);
              auVar51 = vorps_avx(auVar50,auVar46);
              auVar129._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
              auVar129._8_4_ = auVar80._24_4_;
              auVar129._12_4_ = auVar80._28_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar129,auVar51);
              auVar61._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
              auVar61._8_4_ = auVar80._8_4_;
              auVar61._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar61,auVar58);
              auVar109 = vpackssdw_avx(auVar53,auVar109);
              auVar130._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
              auVar130._8_4_ = auVar81._24_4_;
              auVar130._12_4_ = auVar81._28_4_ ^ 0x80000000;
              auVar51 = vpcmpgtq_avx(auVar130,auVar51);
              auVar94._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
              auVar94._8_4_ = auVar81._8_4_;
              auVar94._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar94,auVar52);
              auVar51 = vpackssdw_avx(auVar53,auVar51);
              auVar51 = vpackssdw_avx(auVar51 ^ auVar120,auVar109 ^ auVar120);
              auVar109 = vpmovsxwd_avx(auVar51);
              auVar51 = vpunpckhwd_avx(auVar51,auVar51);
              auVar84._16_16_ = auVar51;
              auVar84._0_16_ = auVar109;
              auVar81 = vmaskmovps_avx(auVar84,*(undefined1 (*) [32])(*pauVar29 + uVar36 * 4));
              auVar103._0_4_ = fVar141 + fVar156 * auVar81._0_4_;
              auVar103._4_4_ = fVar142 + fVar157 * auVar81._4_4_;
              auVar103._8_4_ = fVar154 + fVar158 * auVar81._8_4_;
              auVar103._12_4_ = fVar155 + fVar159 * auVar81._12_4_;
              auVar103._16_4_ = fVar141 + fVar156 * auVar81._16_4_;
              auVar103._20_4_ = fVar142 + fVar157 * auVar81._20_4_;
              auVar103._24_4_ = fVar154 + fVar158 * auVar81._24_4_;
              auVar103._28_4_ = fVar155 + auVar81._28_4_;
              in_ZMM1 = ZEXT3264(auVar103);
              auVar81 = vmaskmovps_avx(auVar84,auVar103);
              *(undefined1 (*) [32])(*pauVar29 + uVar36 * 4) = auVar81;
              uVar36 = uVar36 + 8;
            } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          }
        }
        else if (0 < (int)uVar18) {
          pfVar26 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar30 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar31 = (float *)(lVar30 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar23 = 0;
          do {
            fVar154 = fVar141 * *pfVar26;
            in_ZMM1 = ZEXT464((uint)fVar154);
            fVar154 = fVar154 + *pfVar31;
            fVar155 = fVar142 * *pfVar26;
            auVar58 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
            auVar52 = vshufps_avx(ZEXT416((uint)fVar154),ZEXT416((uint)fVar154),0);
            fVar159 = auVar52._0_4_;
            fVar160 = auVar52._4_4_;
            fVar161 = auVar52._8_4_;
            fVar135 = auVar52._12_4_;
            fVar156 = auVar58._0_4_;
            fVar157 = auVar58._4_4_;
            fVar158 = auVar58._8_4_;
            if ((int)uVar19 < 8) {
              uVar22 = 0;
            }
            else {
              iVar20 = 7;
              do {
                auVar101._0_4_ = fVar156 * *(float *)*pauVar29 + fVar159;
                auVar101._4_4_ = fVar157 * *(float *)(*pauVar29 + 4) + fVar160;
                auVar101._8_4_ = fVar158 * *(float *)(*pauVar29 + 8) + fVar161;
                auVar101._12_4_ = auVar58._12_4_ * *(float *)(*pauVar29 + 0xc) + fVar135;
                auVar101._16_4_ = fVar156 * *(float *)(*pauVar29 + 0x10) + fVar159;
                auVar101._20_4_ = fVar157 * *(float *)(*pauVar29 + 0x14) + fVar160;
                auVar101._24_4_ = fVar158 * *(float *)(*pauVar29 + 0x18) + fVar161;
                auVar101._28_4_ = in_ZMM1._28_4_ + fVar135;
                in_ZMM1 = ZEXT3264(auVar101);
                *pauVar29 = auVar101;
                pauVar29 = pauVar29 + 1;
                iVar20 = iVar20 + 8;
                uVar22 = uVar19 & 0xfffffff8;
              } while (iVar20 < (int)uVar19);
            }
            uVar34 = uVar22 | 3;
            while ((int)uVar34 < (int)uVar19) {
              fVar140 = *(float *)(*pauVar29 + 4);
              fVar143 = *(float *)(*pauVar29 + 8);
              fVar144 = *(float *)(*pauVar29 + 0xc);
              *(float *)*pauVar29 = fVar159 + fVar156 * *(float *)*pauVar29;
              *(float *)(*pauVar29 + 4) = fVar160 + fVar157 * fVar140;
              *(float *)(*pauVar29 + 8) = fVar161 + fVar158 * fVar143;
              *(float *)(*pauVar29 + 0xc) = fVar135 + auVar58._12_4_ * fVar144;
              pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
              uVar34 = uVar22 + 7;
              uVar22 = uVar22 + 4;
            }
            iVar20 = uVar19 - uVar22;
            if (iVar20 != 0 && (int)uVar22 <= (int)uVar19) {
              do {
                *(float *)*pauVar29 = fVar154 + fVar155 * *(float *)*pauVar29;
                pauVar29 = (undefined1 (*) [32])(*pauVar29 + 4);
                iVar20 = iVar20 + -1;
              } while (iVar20 != 0);
            }
            pfVar26 = pfVar26 + 1;
            pfVar31 = pfVar31 + 1;
            uVar23 = uVar23 + 1;
          } while (uVar23 != uVar18);
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < (this->super_GroupNorm).group);
    }
  }
  else if (iVar20 == 1) {
    if (0 < (this->super_GroupNorm).group) {
      uVar19 = uVar18 & 0xfffffff8;
      lVar27 = 0;
      auVar118._8_8_ = 0x8000000000000000;
      auVar118._0_8_ = 0x8000000000000000;
      auVar120 = vpcmpeqd_avx(auVar120,auVar120);
      do {
        lVar30 = lVar27 * (int)uVar18;
        pauVar29 = (undefined1 (*) [32])
                   (bottom_top_blob->elemsize * lVar30 + (long)bottom_top_blob->data);
        fVar141 = 0.0;
        fVar142 = 0.0;
        fVar135 = 0.0;
        fVar140 = 0.0;
        fVar143 = 0.0;
        fVar144 = 0.0;
        fVar145 = 0.0;
        fVar146 = 0.0;
        pauVar25 = pauVar29;
        uVar28 = 0;
        fVar154 = 0.0;
        fVar155 = 0.0;
        fVar156 = 0.0;
        fVar157 = 0.0;
        fVar158 = 0.0;
        fVar159 = 0.0;
        fVar160 = 0.0;
        fVar161 = 0.0;
        if (7 < (int)uVar18) {
          iVar20 = 7;
          do {
            fVar135 = fVar135 + *(float *)*pauVar25;
            fVar140 = fVar140 + *(float *)(*pauVar25 + 4);
            fVar141 = fVar141 + *(float *)(*pauVar25 + 8);
            fVar142 = fVar142 + *(float *)(*pauVar25 + 0xc);
            fVar143 = fVar143 + *(float *)(*pauVar25 + 0x10);
            fVar144 = fVar144 + *(float *)(*pauVar25 + 0x14);
            fVar145 = fVar145 + *(float *)(*pauVar25 + 0x18);
            fVar146 = fVar146 + *(float *)(*pauVar25 + 0x1c);
            pauVar25 = pauVar25 + 1;
            iVar20 = iVar20 + 8;
            uVar28 = uVar19;
            fVar154 = fVar135;
            fVar155 = fVar140;
            fVar156 = fVar141;
            fVar157 = fVar142;
            fVar158 = fVar143;
            fVar159 = fVar144;
            fVar160 = fVar145;
            fVar161 = fVar146;
          } while (iVar20 < (int)uVar18);
        }
        uVar21 = uVar28 | 3;
        auVar147 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar141 = auVar147._4_4_;
          fVar142 = auVar147._8_4_;
          fVar135 = auVar147._12_4_;
          if ((int)uVar18 <= (int)uVar21) break;
          auVar147._0_4_ = auVar147._0_4_ + *(float *)*pauVar25;
          auVar147._4_4_ = fVar141 + *(float *)(*pauVar25 + 4);
          auVar147._8_4_ = fVar142 + *(float *)(*pauVar25 + 8);
          auVar147._12_4_ = fVar135 + *(float *)(*pauVar25 + 0xc);
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          uVar21 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        auVar38._0_4_ = fVar154 + fVar158;
        auVar38._4_4_ = fVar155 + fVar159;
        auVar38._8_4_ = fVar156 + fVar160;
        auVar38._12_4_ = fVar157 + fVar161;
        auVar46 = vshufpd_avx(auVar38,auVar38,1);
        auVar39._0_4_ = auVar46._0_4_ + auVar38._0_4_;
        auVar39._4_4_ = auVar46._4_4_ + auVar38._4_4_;
        auVar39._8_4_ = auVar46._8_4_ + auVar38._8_4_;
        auVar39._12_4_ = auVar46._12_4_ + auVar38._12_4_;
        auVar46 = vshufpd_avx(auVar147,auVar147,1);
        auVar105._0_4_ = auVar147._0_4_ + auVar46._0_4_;
        auVar105._4_4_ = fVar141 + auVar46._4_4_;
        auVar105._8_4_ = fVar142 + auVar46._8_4_;
        auVar105._12_4_ = fVar135 + auVar46._12_4_;
        auVar46 = vhaddps_avx(auVar39,auVar39);
        auVar58 = vmovshdup_avx(auVar105);
        fVar141 = auVar46._0_4_ + auVar58._0_4_ + auVar105._0_4_;
        if ((int)uVar28 < (int)uVar18) {
          uVar32 = CONCAT44(0,~uVar28 + uVar18);
          auVar46 = vblendps_avx(ZEXT416((uint)fVar141),_DAT_005f00d0,0xe);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = uVar32;
          auVar50 = vpshufd_avx(auVar40,0x44);
          auVar58 = vorps_avx(auVar50,auVar118);
          auVar52 = vorps_avx(auVar50,auVar118);
          uVar36 = 0;
          auVar152 = ZEXT1664(auVar46);
          do {
            auVar172 = auVar152;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = uVar36;
            auVar46 = vpshufd_avx(auVar41,0x44);
            auVar75._16_16_ = auVar46;
            auVar75._0_16_ = auVar46;
            auVar81 = vorps_avx(auVar75,auVar15);
            auVar80 = vorps_avx(auVar75,auVar16);
            auVar46 = vorps_avx(auVar50,auVar118);
            auVar121._8_4_ = auVar80._24_4_;
            auVar121._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
            auVar121._12_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar109 = vpcmpgtq_avx(auVar121,auVar46);
            auVar106._8_4_ = auVar80._8_4_;
            auVar173._8_4_ = auVar106._8_4_;
            auVar173._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar173._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar51 = vpcmpgtq_avx(auVar173,auVar58);
            auVar51 = vpackssdw_avx(auVar51,auVar109);
            auVar178._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
            auVar178._8_4_ = auVar81._24_4_;
            auVar178._12_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar178,auVar46);
            auVar179._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar179._8_4_ = auVar81._8_4_;
            auVar179._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar179,auVar52);
            auVar46 = vpackssdw_avx(auVar46,auVar53);
            auVar46 = vpackssdw_avx(auVar46 ^ auVar120,auVar51 ^ auVar120);
            auVar51 = vpmovsxwd_avx(auVar46);
            auVar46 = vpunpckhwd_avx(auVar46,auVar46);
            auVar176._16_16_ = auVar46;
            auVar176._0_16_ = auVar51;
            auVar177 = vmaskmovps_avx(auVar176,*(undefined1 (*) [32])(*pauVar25 + uVar36 * 4));
            auVar136._0_4_ = auVar177._0_4_ + auVar172._0_4_;
            auVar136._4_4_ = auVar177._4_4_ + auVar172._4_4_;
            auVar136._8_4_ = auVar177._8_4_ + auVar172._8_4_;
            auVar136._12_4_ = auVar177._12_4_ + auVar172._12_4_;
            auVar138._16_4_ = auVar177._16_4_ + auVar172._16_4_;
            auVar138._0_16_ = auVar136;
            auVar138._20_4_ = auVar177._20_4_ + auVar172._20_4_;
            auVar138._24_4_ = auVar177._24_4_ + auVar172._24_4_;
            auVar138._28_4_ = auVar177._28_4_ + auVar172._28_4_;
            uVar36 = uVar36 + 8;
            auVar152 = ZEXT3264(auVar138);
          } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          auVar46 = vorps_avx(auVar50,auVar118);
          auVar106._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
          auVar106._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar106,auVar46);
          auVar58 = vpackssdw_avx(auVar46,auVar109);
          auVar46 = vorps_avx(auVar50,auVar118);
          auVar148._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
          auVar148._8_4_ = auVar81._8_4_;
          auVar148._12_4_ = auVar81._12_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar148,auVar46);
          auVar46 = vpackssdw_avx(auVar46,auVar53);
          auVar46 = vblendvps_avx(auVar172._0_16_,auVar136,auVar46 ^ auVar120);
          auVar58 = vblendvps_avx(auVar172._16_16_,auVar138._16_16_,auVar58 ^ auVar120);
          auVar46 = vhaddps_avx(auVar58,auVar46);
          auVar46 = vhaddps_avx(auVar46,auVar46);
          auVar46 = vhaddps_avx(auVar46,auVar46);
          fVar141 = auVar46._0_4_;
        }
        fVar141 = (1.0 / (float)(int)uVar18) * fVar141;
        auVar46 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
        pauVar25 = pauVar29;
        if ((int)uVar18 < 8) {
          fVar142 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          uVar28 = 0;
        }
        else {
          auVar76._16_16_ = auVar46;
          auVar76._0_16_ = auVar46;
          fVar142 = 0.0;
          fVar154 = 0.0;
          fVar155 = 0.0;
          fVar156 = 0.0;
          fVar157 = 0.0;
          fVar158 = 0.0;
          fVar159 = 0.0;
          fVar160 = 0.0;
          iVar20 = 7;
          do {
            auVar81 = vsubps_avx(*pauVar25,auVar76);
            fVar142 = fVar142 + auVar81._0_4_ * auVar81._0_4_;
            fVar154 = fVar154 + auVar81._4_4_ * auVar81._4_4_;
            fVar155 = fVar155 + auVar81._8_4_ * auVar81._8_4_;
            fVar156 = fVar156 + auVar81._12_4_ * auVar81._12_4_;
            fVar157 = fVar157 + auVar81._16_4_ * auVar81._16_4_;
            fVar158 = fVar158 + auVar81._20_4_ * auVar81._20_4_;
            fVar159 = fVar159 + auVar81._24_4_ * auVar81._24_4_;
            fVar160 = fVar160 + auVar81._28_4_;
            pauVar25 = pauVar25 + 1;
            iVar20 = iVar20 + 8;
            uVar28 = uVar19;
          } while (iVar20 < (int)uVar18);
        }
        uVar21 = uVar28 | 3;
        auVar162 = ZEXT816(0) << 0x40;
        while( true ) {
          fVar161 = auVar162._4_4_;
          fVar135 = auVar162._8_4_;
          fVar140 = auVar162._12_4_;
          if ((int)uVar18 <= (int)uVar21) break;
          auVar58 = vsubps_avx(*(undefined1 (*) [16])*pauVar25,auVar46);
          auVar162._0_4_ = auVar162._0_4_ + auVar58._0_4_ * auVar58._0_4_;
          auVar162._4_4_ = fVar161 + auVar58._4_4_ * auVar58._4_4_;
          auVar162._8_4_ = fVar135 + auVar58._8_4_ * auVar58._8_4_;
          auVar162._12_4_ = fVar140 + auVar58._12_4_ * auVar58._12_4_;
          pauVar25 = (undefined1 (*) [32])(*pauVar25 + 0x10);
          uVar21 = uVar28 + 7;
          uVar28 = uVar28 + 4;
        }
        auVar42._0_4_ = fVar142 + fVar157;
        auVar42._4_4_ = fVar154 + fVar158;
        auVar42._8_4_ = fVar155 + fVar159;
        auVar42._12_4_ = fVar156 + fVar160;
        auVar58 = vshufpd_avx(auVar42,auVar42,1);
        auVar43._0_4_ = auVar58._0_4_ + auVar42._0_4_;
        auVar43._4_4_ = auVar58._4_4_ + auVar42._4_4_;
        auVar43._8_4_ = auVar58._8_4_ + auVar42._8_4_;
        auVar43._12_4_ = auVar58._12_4_ + auVar42._12_4_;
        auVar58 = vshufpd_avx(auVar162,auVar162,1);
        auVar107._0_4_ = auVar162._0_4_ + auVar58._0_4_;
        auVar107._4_4_ = fVar161 + auVar58._4_4_;
        auVar107._8_4_ = fVar135 + auVar58._8_4_;
        auVar107._12_4_ = fVar140 + auVar58._12_4_;
        auVar58 = vhaddps_avx(auVar43,auVar43);
        auVar52 = vmovshdup_avx(auVar107);
        fVar142 = auVar58._0_4_ + auVar52._0_4_ + auVar107._0_4_;
        if ((int)uVar28 < (int)uVar18) {
          uVar32 = CONCAT44(0,~uVar28 + uVar18);
          auVar58 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_005f00d0,0xe);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = uVar32;
          auVar50 = vpshufd_avx(auVar44,0x44);
          auVar165._16_16_ = auVar46;
          auVar165._0_16_ = auVar46;
          auVar46 = vorps_avx(auVar50,auVar118);
          auVar52 = vorps_avx(auVar50,auVar118);
          uVar36 = 0;
          auVar152 = ZEXT1664(auVar58);
          do {
            auVar172 = auVar152;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar36;
            auVar58 = vpshufd_avx(auVar45,0x44);
            auVar77._16_16_ = auVar58;
            auVar77._0_16_ = auVar58;
            auVar81 = vorps_avx(auVar77,auVar15);
            auVar80 = vorps_avx(auVar77,auVar16);
            auVar58 = vorps_avx(auVar50,auVar118);
            auVar122._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
            auVar122._8_4_ = auVar80._24_4_;
            auVar122._12_4_ = auVar80._28_4_ ^ 0x80000000;
            auVar109 = vpcmpgtq_avx(auVar122,auVar58);
            auVar184._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar108._8_4_ = auVar80._8_4_;
            auVar184._8_4_ = auVar108._8_4_;
            auVar184._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar51 = vpcmpgtq_avx(auVar184,auVar46);
            auVar51 = vpackssdw_avx(auVar51,auVar109);
            auVar89._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
            auVar89._8_4_ = auVar81._24_4_;
            auVar89._12_4_ = auVar81._28_4_ ^ 0x80000000;
            auVar53 = vpcmpgtq_avx(auVar89,auVar58);
            auVar90._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar90._8_4_ = auVar81._8_4_;
            auVar90._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar90,auVar52);
            auVar58 = vpackssdw_avx(auVar58,auVar53);
            auVar58 = vpackssdw_avx(auVar58 ^ auVar120,auVar51 ^ auVar120);
            auVar51 = vpmovsxwd_avx(auVar58);
            auVar58 = vpunpckhwd_avx(auVar58,auVar58);
            auVar98._16_16_ = auVar58;
            auVar98._0_16_ = auVar51;
            auVar177 = vmaskmovps_avx(auVar98,*(undefined1 (*) [32])(*pauVar25 + uVar36 * 4));
            auVar177 = vsubps_avx(auVar177,auVar165);
            auVar185._0_4_ = auVar172._0_4_ + auVar177._0_4_ * auVar177._0_4_;
            auVar185._4_4_ = auVar172._4_4_ + auVar177._4_4_ * auVar177._4_4_;
            auVar185._8_4_ = auVar172._8_4_ + auVar177._8_4_ * auVar177._8_4_;
            auVar185._12_4_ = auVar172._12_4_ + auVar177._12_4_ * auVar177._12_4_;
            auVar190._16_4_ = auVar172._16_4_ + auVar177._16_4_ * auVar177._16_4_;
            auVar190._0_16_ = auVar185;
            auVar190._20_4_ = auVar172._20_4_ + auVar177._20_4_ * auVar177._20_4_;
            auVar190._24_4_ = auVar172._24_4_ + auVar177._24_4_ * auVar177._24_4_;
            auVar190._28_4_ = auVar172._28_4_ + auVar177._28_4_;
            uVar36 = uVar36 + 8;
            auVar152 = ZEXT3264(auVar190);
          } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          auVar46 = vorps_avx(auVar50,auVar118);
          auVar108._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
          auVar108._12_4_ = auVar80._12_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar108,auVar46);
          auVar58 = vpackssdw_avx(auVar46,auVar109);
          auVar46 = vorps_avx(auVar50,auVar118);
          auVar123._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
          auVar123._8_4_ = auVar81._8_4_;
          auVar123._12_4_ = auVar81._12_4_ ^ 0x80000000;
          auVar46 = vpcmpgtq_avx(auVar123,auVar46);
          auVar46 = vpackssdw_avx(auVar46,auVar53);
          auVar46 = vblendvps_avx(auVar172._0_16_,auVar185,auVar46 ^ auVar120);
          auVar58 = vblendvps_avx(auVar172._16_16_,auVar190._16_16_,auVar58 ^ auVar120);
          auVar46 = vhaddps_avx(auVar58,auVar46);
          auVar46 = vhaddps_avx(auVar46,auVar46);
          auVar46 = vhaddps_avx(auVar46,auVar46);
          fVar142 = auVar46._0_4_;
        }
        auVar46 = ZEXT416((uint)((1.0 / (float)(int)uVar18) * fVar142 + (this->super_GroupNorm).eps)
                         );
        auVar46 = vsqrtss_avx(auVar46,auVar46);
        fVar135 = 1.0 / auVar46._0_4_;
        fVar142 = 0.0;
        fVar141 = fVar135 * -fVar141;
        auVar46 = vshufps_avx(ZEXT416((uint)fVar135),ZEXT416((uint)fVar135),0);
        auVar58 = vshufps_avx(ZEXT416((uint)fVar141),ZEXT416((uint)fVar141),0);
        fVar154 = auVar46._0_4_;
        fVar155 = auVar46._4_4_;
        fVar156 = auVar46._8_4_;
        fVar157 = auVar46._12_4_;
        fVar158 = auVar58._0_4_;
        fVar159 = auVar58._4_4_;
        fVar160 = auVar58._8_4_;
        fVar161 = auVar58._12_4_;
        if ((this->super_GroupNorm).affine == 0) {
          uVar28 = 0;
          if (7 < (int)uVar18) {
            iVar20 = 7;
            do {
              fVar141 = *(float *)(*pauVar29 + 4);
              fVar135 = *(float *)(*pauVar29 + 8);
              fVar140 = *(float *)(*pauVar29 + 0xc);
              fVar143 = *(float *)(*pauVar29 + 0x10);
              fVar144 = *(float *)(*pauVar29 + 0x14);
              fVar145 = *(float *)(*pauVar29 + 0x18);
              fVar142 = fVar161 + fVar142;
              *(float *)*pauVar29 = fVar158 + fVar154 * *(float *)*pauVar29;
              *(float *)(*pauVar29 + 4) = fVar159 + fVar155 * fVar141;
              *(float *)(*pauVar29 + 8) = fVar160 + fVar156 * fVar135;
              *(float *)(*pauVar29 + 0xc) = fVar161 + fVar157 * fVar140;
              *(float *)(*pauVar29 + 0x10) = fVar158 + fVar154 * fVar143;
              *(float *)(*pauVar29 + 0x14) = fVar159 + fVar155 * fVar144;
              *(float *)(*pauVar29 + 0x18) = fVar160 + fVar156 * fVar145;
              *(float *)(*pauVar29 + 0x1c) = fVar142;
              pauVar29 = pauVar29 + 1;
              iVar20 = iVar20 + 8;
              uVar28 = uVar19;
            } while (iVar20 < (int)uVar18);
          }
          uVar21 = uVar28 | 3;
          while ((int)uVar21 < (int)uVar18) {
            fVar141 = *(float *)(*pauVar29 + 4);
            fVar142 = *(float *)(*pauVar29 + 8);
            fVar135 = *(float *)(*pauVar29 + 0xc);
            *(float *)*pauVar29 = fVar158 + fVar154 * *(float *)*pauVar29;
            *(float *)(*pauVar29 + 4) = fVar159 + fVar155 * fVar141;
            *(float *)(*pauVar29 + 8) = fVar160 + fVar156 * fVar142;
            *(float *)(*pauVar29 + 0xc) = fVar161 + fVar157 * fVar135;
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar21 = uVar28 + 7;
            uVar28 = uVar28 + 4;
          }
          if ((int)uVar28 < (int)uVar18) {
            uVar32 = CONCAT44(0,~uVar28 + uVar18);
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar32;
            auVar52 = vpshufd_avx(auVar47,0x44);
            auVar46 = vorps_avx(auVar52,auVar118);
            auVar58 = vorps_avx(auVar52,auVar118);
            uVar36 = 0;
            do {
              auVar48._8_8_ = 0;
              auVar48._0_8_ = uVar36;
              auVar50 = vpshufd_avx(auVar48,0x44);
              auVar78._16_16_ = auVar50;
              auVar78._0_16_ = auVar50;
              auVar81 = vorps_avx(auVar78,auVar15);
              auVar80 = vorps_avx(auVar78,auVar16);
              auVar50 = vorps_avx(auVar52,auVar118);
              auVar124._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
              auVar124._8_4_ = auVar80._24_4_;
              auVar124._12_4_ = auVar80._28_4_ ^ 0x80000000;
              auVar51 = vpcmpgtq_avx(auVar124,auVar50);
              auVar49._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
              auVar49._8_4_ = auVar80._8_4_;
              auVar49._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar49,auVar46);
              auVar51 = vpackssdw_avx(auVar109,auVar51);
              auVar125._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
              auVar125._8_4_ = auVar81._24_4_;
              auVar125._12_4_ = auVar81._28_4_ ^ 0x80000000;
              auVar50 = vpcmpgtq_avx(auVar125,auVar50);
              auVar91._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
              auVar91._8_4_ = auVar81._8_4_;
              auVar91._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar91,auVar58);
              auVar50 = vpackssdw_avx(auVar109,auVar50);
              auVar50 = vpackssdw_avx(auVar50 ^ auVar120,auVar51 ^ auVar120);
              auVar51 = vpmovsxwd_avx(auVar50);
              auVar50 = vpunpckhwd_avx(auVar50,auVar50);
              auVar79._16_16_ = auVar50;
              auVar79._0_16_ = auVar51;
              auVar81 = vmaskmovps_avx(auVar79,*(undefined1 (*) [32])(*pauVar29 + uVar36 * 4));
              auVar99._0_4_ = fVar158 + fVar154 * auVar81._0_4_;
              auVar99._4_4_ = fVar159 + fVar155 * auVar81._4_4_;
              auVar99._8_4_ = fVar160 + fVar156 * auVar81._8_4_;
              auVar99._12_4_ = fVar161 + fVar157 * auVar81._12_4_;
              auVar99._16_4_ = fVar158 + fVar154 * auVar81._16_4_;
              auVar99._20_4_ = fVar159 + fVar155 * auVar81._20_4_;
              auVar99._24_4_ = fVar160 + fVar156 * auVar81._24_4_;
              auVar99._28_4_ = fVar161 + auVar81._28_4_;
              auVar81 = vmaskmovps_avx(auVar79,auVar99);
              *(undefined1 (*) [32])(*pauVar29 + uVar36 * 4) = auVar81;
              uVar36 = uVar36 + 8;
            } while ((uVar32 + 8 & 0x1fffffff8) != uVar36);
          }
        }
        else {
          pfVar26 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar30 +
                             (long)(this->super_GroupNorm).gamma_data.data);
          pfVar31 = (float *)(lVar30 * (this->super_GroupNorm).beta_data.elemsize +
                             (long)(this->super_GroupNorm).beta_data.data);
          uVar28 = 0;
          if (7 < (int)uVar18) {
            iVar20 = 7;
            do {
              fVar140 = *(float *)(*pauVar29 + 4);
              fVar143 = *(float *)(*pauVar29 + 8);
              fVar144 = *(float *)(*pauVar29 + 0xc);
              fVar145 = *(float *)(*pauVar29 + 0x10);
              fVar146 = *(float *)(*pauVar29 + 0x14);
              fVar2 = *(float *)(*pauVar29 + 0x18);
              fVar3 = pfVar26[1];
              fVar4 = pfVar26[2];
              fVar5 = pfVar26[3];
              fVar6 = pfVar26[4];
              fVar7 = pfVar26[5];
              fVar8 = pfVar26[6];
              fVar9 = pfVar31[1];
              fVar10 = pfVar31[2];
              fVar11 = pfVar31[3];
              fVar12 = pfVar31[4];
              fVar13 = pfVar31[5];
              fVar14 = pfVar31[6];
              fVar142 = fVar161 + fVar142 + pfVar31[7];
              *(float *)*pauVar29 = (fVar158 + fVar154 * *(float *)*pauVar29) * *pfVar26 + *pfVar31;
              *(float *)(*pauVar29 + 4) = (fVar159 + fVar155 * fVar140) * fVar3 + fVar9;
              *(float *)(*pauVar29 + 8) = (fVar160 + fVar156 * fVar143) * fVar4 + fVar10;
              *(float *)(*pauVar29 + 0xc) = (fVar161 + fVar157 * fVar144) * fVar5 + fVar11;
              *(float *)(*pauVar29 + 0x10) = (fVar158 + fVar154 * fVar145) * fVar6 + fVar12;
              *(float *)(*pauVar29 + 0x14) = (fVar159 + fVar155 * fVar146) * fVar7 + fVar13;
              *(float *)(*pauVar29 + 0x18) = (fVar160 + fVar156 * fVar2) * fVar8 + fVar14;
              *(float *)(*pauVar29 + 0x1c) = fVar142;
              pfVar26 = pfVar26 + 8;
              pfVar31 = pfVar31 + 8;
              pauVar29 = pauVar29 + 1;
              iVar20 = iVar20 + 8;
              uVar28 = uVar19;
            } while (iVar20 < (int)uVar18);
          }
          uVar21 = uVar28 | 3;
          while ((int)uVar21 < (int)uVar18) {
            fVar142 = *(float *)(*pauVar29 + 4);
            fVar140 = *(float *)(*pauVar29 + 8);
            fVar143 = *(float *)(*pauVar29 + 0xc);
            fVar144 = pfVar26[1];
            fVar145 = pfVar26[2];
            fVar146 = pfVar26[3];
            fVar2 = pfVar31[1];
            fVar3 = pfVar31[2];
            fVar4 = pfVar31[3];
            *(float *)*pauVar29 = (fVar158 + fVar154 * *(float *)*pauVar29) * *pfVar26 + *pfVar31;
            *(float *)(*pauVar29 + 4) = (fVar159 + fVar155 * fVar142) * fVar144 + fVar2;
            *(float *)(*pauVar29 + 8) = (fVar160 + fVar156 * fVar140) * fVar145 + fVar3;
            *(float *)(*pauVar29 + 0xc) = (fVar161 + fVar157 * fVar143) * fVar146 + fVar4;
            pfVar26 = pfVar26 + 4;
            pfVar31 = pfVar31 + 4;
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar21 = uVar28 + 7;
            uVar28 = uVar28 + 4;
          }
          if ((int)uVar28 < (int)uVar18) {
            lVar30 = 0;
            do {
              *(float *)(*pauVar29 + lVar30 * 4) =
                   (fVar141 + fVar135 * *(float *)(*pauVar29 + lVar30 * 4)) * pfVar26[lVar30] +
                   pfVar31[lVar30];
              lVar30 = lVar30 + 1;
            } while (uVar18 - uVar28 != (int)lVar30);
          }
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < (this->super_GroupNorm).group);
    }
  }
  else if ((iVar20 - 3U < 2) && (0 < (this->super_GroupNorm).group)) {
    uVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    uVar28 = uVar19 & 0xfffffff8;
    fVar141 = 1.0 / (float)(int)(uVar19 * uVar18);
    lVar27 = 0;
    auVar119._8_8_ = 0x8000000000000000;
    auVar119._0_8_ = 0x8000000000000000;
    auVar120 = vpcmpeqd_avx(auVar120,auVar120);
    do {
      lVar37 = lVar27 * (int)uVar18;
      uVar32 = bottom_top_blob->elemsize;
      lVar30 = bottom_top_blob->cstep * lVar37 * uVar32;
      pvVar1 = bottom_top_blob->data;
      uVar17 = ((long)bottom_top_blob->d * uVar32 *
                (long)bottom_top_blob->h * (long)bottom_top_blob->w + 0xf & 0xfffffffffffffff0) /
               uVar32;
      fVar154 = 0.0;
      auVar152 = ZEXT1664(ZEXT816(0) << 0x40);
      fVar142 = 0.0;
      if (0 < (int)uVar18) {
        uVar33 = 0;
        do {
          pfVar26 = (float *)((long)pvVar1 + uVar17 * uVar32 * uVar33 + lVar30);
          if ((int)uVar19 < 8) {
            fVar142 = 0.0;
            fVar155 = 0.0;
            fVar156 = 0.0;
            fVar157 = 0.0;
            fVar158 = 0.0;
            fVar159 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            uVar21 = 0;
          }
          else {
            fVar142 = 0.0;
            fVar155 = 0.0;
            fVar156 = 0.0;
            fVar157 = 0.0;
            fVar158 = 0.0;
            fVar159 = 0.0;
            fVar160 = 0.0;
            fVar161 = 0.0;
            iVar20 = 7;
            do {
              fVar142 = fVar142 + *pfVar26;
              fVar155 = fVar155 + pfVar26[1];
              fVar156 = fVar156 + pfVar26[2];
              fVar157 = fVar157 + pfVar26[3];
              fVar158 = fVar158 + pfVar26[4];
              fVar159 = fVar159 + pfVar26[5];
              fVar160 = fVar160 + pfVar26[6];
              fVar161 = fVar161 + pfVar26[7];
              pfVar26 = pfVar26 + 8;
              iVar20 = iVar20 + 8;
              uVar21 = uVar28;
            } while (iVar20 < (int)uVar19);
          }
          uVar23 = uVar21 | 3;
          auVar164 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar135 = auVar164._4_4_;
            fVar140 = auVar164._8_4_;
            fVar143 = auVar164._12_4_;
            if ((int)uVar19 <= (int)uVar23) break;
            auVar164._0_4_ = auVar164._0_4_ + *pfVar26;
            auVar164._4_4_ = fVar135 + pfVar26[1];
            auVar164._8_4_ = fVar140 + pfVar26[2];
            auVar164._12_4_ = fVar143 + pfVar26[3];
            pfVar26 = pfVar26 + 4;
            uVar23 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          auVar62._0_4_ = fVar142 + fVar158;
          auVar62._4_4_ = fVar155 + fVar159;
          auVar62._8_4_ = fVar156 + fVar160;
          auVar62._12_4_ = fVar157 + fVar161;
          auVar46 = vshufpd_avx(auVar62,auVar62,1);
          auVar63._0_4_ = auVar46._0_4_ + auVar62._0_4_;
          auVar63._4_4_ = auVar46._4_4_ + auVar62._4_4_;
          auVar63._8_4_ = auVar46._8_4_ + auVar62._8_4_;
          auVar63._12_4_ = auVar46._12_4_ + auVar62._12_4_;
          auVar46 = vmovshdup_avx(auVar63);
          auVar58 = vshufpd_avx(auVar164,auVar164,1);
          auVar131._0_4_ = auVar164._0_4_ + auVar58._0_4_;
          auVar131._4_4_ = fVar135 + auVar58._4_4_;
          auVar131._8_4_ = fVar140 + auVar58._8_4_;
          auVar131._12_4_ = fVar143 + auVar58._12_4_;
          auVar58 = vmovshdup_avx(auVar131);
          fVar142 = auVar58._0_4_ + auVar152._0_4_ + auVar46._0_4_ + auVar63._0_4_ + auVar131._0_4_;
          auVar152 = ZEXT464((uint)fVar142);
          if ((int)uVar21 < (int)uVar19) {
            uVar24 = CONCAT44(0,~uVar21 + uVar19);
            auVar46 = vblendps_avx(ZEXT416((uint)fVar142),_DAT_005f00d0,0xe);
            auVar64._8_8_ = 0;
            auVar64._0_8_ = uVar24;
            auVar50 = vpshufd_avx(auVar64,0x44);
            auVar58 = vorps_avx(auVar50,auVar119);
            auVar52 = vorps_avx(auVar50,auVar119);
            uVar35 = 0;
            auVar152 = ZEXT1664(auVar46);
            do {
              auVar172 = auVar152;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = uVar35;
              auVar46 = vpshufd_avx(auVar65,0x44);
              auVar85._16_16_ = auVar46;
              auVar85._0_16_ = auVar46;
              auVar81 = vorps_avx(auVar85,auVar15);
              auVar80 = vorps_avx(auVar85,auVar16);
              auVar46 = vorps_avx(auVar50,auVar119);
              auVar95._8_4_ = auVar80._24_4_;
              auVar95._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
              auVar95._12_4_ = auVar80._28_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar95,auVar46);
              auVar66._8_4_ = auVar80._8_4_;
              auVar182._8_4_ = auVar66._8_4_;
              auVar182._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
              auVar182._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar51 = vpcmpgtq_avx(auVar182,auVar58);
              auVar51 = vpackssdw_avx(auVar51,auVar109);
              auVar188._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
              auVar188._8_4_ = auVar81._24_4_;
              auVar188._12_4_ = auVar81._28_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar188,auVar46);
              auVar189._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
              auVar189._8_4_ = auVar81._8_4_;
              auVar189._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar46 = vpcmpgtq_avx(auVar189,auVar52);
              auVar46 = vpackssdw_avx(auVar46,auVar53);
              auVar46 = vpackssdw_avx(auVar46 ^ auVar120,auVar51 ^ auVar120);
              auVar51 = vpmovsxwd_avx(auVar46);
              auVar46 = vpunpckhwd_avx(auVar46,auVar46);
              auVar183._16_16_ = auVar46;
              auVar183._0_16_ = auVar51;
              auVar177 = vmaskmovps_avx(auVar183,*(undefined1 (*) [32])(pfVar26 + uVar35));
              auVar150._0_4_ = auVar177._0_4_ + auVar172._0_4_;
              auVar150._4_4_ = auVar177._4_4_ + auVar172._4_4_;
              auVar150._8_4_ = auVar177._8_4_ + auVar172._8_4_;
              auVar150._12_4_ = auVar177._12_4_ + auVar172._12_4_;
              auVar151._16_4_ = auVar177._16_4_ + auVar172._16_4_;
              auVar151._0_16_ = auVar150;
              auVar151._20_4_ = auVar177._20_4_ + auVar172._20_4_;
              auVar151._24_4_ = auVar177._24_4_ + auVar172._24_4_;
              auVar151._28_4_ = auVar177._28_4_ + auVar172._28_4_;
              uVar35 = uVar35 + 8;
              auVar152 = ZEXT3264(auVar151);
            } while ((uVar24 + 8 & 0x1fffffff8) != uVar35);
            auVar46 = vorps_avx(auVar50,auVar119);
            auVar66._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar66._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar66,auVar46);
            auVar58 = vpackssdw_avx(auVar46,auVar109);
            auVar46 = vorps_avx(auVar50,auVar119);
            auVar153._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar153._8_4_ = auVar81._8_4_;
            auVar153._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar46 = vpcmpgtq_avx(auVar153,auVar46);
            auVar46 = vpackssdw_avx(auVar46,auVar53);
            auVar46 = vblendvps_avx(auVar172._0_16_,auVar150,auVar46 ^ auVar120);
            auVar58 = vblendvps_avx(auVar172._16_16_,auVar151._16_16_,auVar58 ^ auVar120);
            auVar46 = vhaddps_avx(auVar58,auVar46);
            auVar46 = vhaddps_avx(auVar46,auVar46);
            auVar46 = vhaddps_avx(auVar46,auVar46);
            auVar152 = ZEXT1664(auVar46);
          }
          fVar142 = auVar152._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar36);
      }
      pfVar26 = (float *)((this->super_GroupNorm).gamma_data.elemsize * lVar37 +
                         (long)(this->super_GroupNorm).gamma_data.data);
      pfVar31 = (float *)(lVar37 * (this->super_GroupNorm).beta_data.elemsize +
                         (long)(this->super_GroupNorm).beta_data.data);
      fVar142 = fVar142 * fVar141;
      if (0 < (int)uVar18) {
        auVar46 = vpermilps_avx(ZEXT416((uint)fVar142),0);
        auVar167._16_16_ = auVar46;
        auVar167._0_16_ = auVar46;
        auVar152 = ZEXT464(0) << 0x40;
        uVar33 = 0;
        do {
          pauVar29 = (undefined1 (*) [32])((long)pvVar1 + uVar17 * uVar32 * uVar33 + lVar30);
          if ((int)uVar19 < 8) {
            auVar170 = SUB6432(ZEXT864(0),0);
            uVar21 = 0;
          }
          else {
            auVar172 = ZEXT864(0);
            iVar20 = 7;
            do {
              auVar81 = vsubps_avx(*pauVar29,auVar167);
              auVar170._0_4_ = auVar172._0_4_ + auVar81._0_4_ * auVar81._0_4_;
              auVar170._4_4_ = auVar172._4_4_ + auVar81._4_4_ * auVar81._4_4_;
              auVar170._8_4_ = auVar172._8_4_ + auVar81._8_4_ * auVar81._8_4_;
              auVar170._12_4_ = auVar172._12_4_ + auVar81._12_4_ * auVar81._12_4_;
              auVar170._16_4_ = auVar172._16_4_ + auVar81._16_4_ * auVar81._16_4_;
              auVar170._20_4_ = auVar172._20_4_ + auVar81._20_4_ * auVar81._20_4_;
              auVar170._24_4_ = auVar172._24_4_ + auVar81._24_4_ * auVar81._24_4_;
              auVar170._28_4_ = auVar172._28_4_ + auVar81._28_4_;
              auVar172 = ZEXT3264(auVar170);
              pauVar29 = pauVar29 + 1;
              iVar20 = iVar20 + 8;
              uVar21 = uVar28;
            } while (iVar20 < (int)uVar19);
          }
          uVar23 = uVar21 | 3;
          auVar175 = ZEXT816(0) << 0x40;
          while( true ) {
            fVar154 = auVar175._4_4_;
            fVar155 = auVar175._8_4_;
            fVar156 = auVar175._12_4_;
            if ((int)uVar19 <= (int)uVar23) break;
            auVar58 = vsubps_avx(*(undefined1 (*) [16])*pauVar29,auVar46);
            auVar175._0_4_ = auVar175._0_4_ + auVar58._0_4_ * auVar58._0_4_;
            auVar175._4_4_ = fVar154 + auVar58._4_4_ * auVar58._4_4_;
            auVar175._8_4_ = fVar155 + auVar58._8_4_ * auVar58._8_4_;
            auVar175._12_4_ = fVar156 + auVar58._12_4_ * auVar58._12_4_;
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar23 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          auVar67._0_4_ = auVar170._0_4_ + auVar170._16_4_;
          auVar67._4_4_ = auVar170._4_4_ + auVar170._20_4_;
          auVar67._8_4_ = auVar170._8_4_ + auVar170._24_4_;
          auVar67._12_4_ = auVar170._12_4_ + auVar170._28_4_;
          auVar58 = vshufpd_avx(auVar67,auVar67,1);
          auVar68._0_4_ = auVar58._0_4_ + auVar67._0_4_;
          auVar68._4_4_ = auVar58._4_4_ + auVar67._4_4_;
          auVar68._8_4_ = auVar58._8_4_ + auVar67._8_4_;
          auVar68._12_4_ = auVar58._12_4_ + auVar67._12_4_;
          auVar58 = vmovshdup_avx(auVar68);
          auVar52 = vshufpd_avx(auVar175,auVar175,1);
          auVar132._0_4_ = auVar175._0_4_ + auVar52._0_4_;
          auVar132._4_4_ = fVar154 + auVar52._4_4_;
          auVar132._8_4_ = fVar155 + auVar52._8_4_;
          auVar132._12_4_ = fVar156 + auVar52._12_4_;
          auVar52 = vmovshdup_avx(auVar132);
          fVar154 = auVar52._0_4_ + auVar152._0_4_ + auVar58._0_4_ + auVar68._0_4_ + auVar132._0_4_;
          auVar152 = ZEXT464((uint)fVar154);
          if ((int)uVar21 < (int)uVar19) {
            uVar24 = CONCAT44(0,~uVar21 + uVar19);
            auVar58 = vblendps_avx(ZEXT416((uint)fVar154),_DAT_005f00d0,0xe);
            auVar69._8_8_ = 0;
            auVar69._0_8_ = uVar24;
            auVar51 = vpshufd_avx(auVar69,0x44);
            auVar52 = vorps_avx(auVar51,auVar119);
            auVar50 = vorps_avx(auVar51,auVar119);
            uVar35 = 0;
            auVar152 = ZEXT1664(auVar58);
            do {
              auVar172 = auVar152;
              auVar70._8_8_ = 0;
              auVar70._0_8_ = uVar35;
              auVar58 = vpshufd_avx(auVar70,0x44);
              auVar86._16_16_ = auVar58;
              auVar86._0_16_ = auVar58;
              auVar81 = vorps_avx(auVar86,auVar15);
              auVar80 = vorps_avx(auVar86,auVar16);
              auVar58 = vorps_avx(auVar51,auVar119);
              auVar96._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
              auVar96._8_4_ = auVar80._24_4_;
              auVar96._12_4_ = auVar80._28_4_ ^ 0x80000000;
              auVar53 = vpcmpgtq_avx(auVar96,auVar58);
              auVar168._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
              auVar71._8_4_ = auVar80._8_4_;
              auVar168._8_4_ = auVar71._8_4_;
              auVar168._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar168,auVar52);
              auVar109 = vpackssdw_avx(auVar109,auVar53);
              auVar113._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
              auVar113._8_4_ = auVar81._24_4_;
              auVar113._12_4_ = auVar81._28_4_ ^ 0x80000000;
              auVar126 = vpcmpgtq_avx(auVar113,auVar58);
              auVar114._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
              auVar114._8_4_ = auVar81._8_4_;
              auVar114._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar58 = vpcmpgtq_avx(auVar114,auVar50);
              auVar58 = vpackssdw_avx(auVar58,auVar126);
              auVar58 = vpackssdw_avx(auVar58 ^ auVar120,auVar109 ^ auVar120);
              auVar109 = vpmovsxwd_avx(auVar58);
              auVar58 = vpunpckhwd_avx(auVar58,auVar58);
              auVar116._16_16_ = auVar58;
              auVar116._0_16_ = auVar109;
              auVar177 = vmaskmovps_avx(auVar116,*(undefined1 (*) [32])(*pauVar29 + uVar35 * 4));
              auVar177 = vsubps_avx(auVar177,auVar167);
              auVar169._0_4_ = auVar177._0_4_ * auVar177._0_4_ + auVar172._0_4_;
              auVar169._4_4_ = auVar177._4_4_ * auVar177._4_4_ + auVar172._4_4_;
              auVar169._8_4_ = auVar177._8_4_ * auVar177._8_4_ + auVar172._8_4_;
              auVar169._12_4_ = auVar177._12_4_ * auVar177._12_4_ + auVar172._12_4_;
              auVar171._16_4_ = auVar177._16_4_ * auVar177._16_4_ + auVar172._16_4_;
              auVar171._0_16_ = auVar169;
              auVar171._20_4_ = auVar177._20_4_ * auVar177._20_4_ + auVar172._20_4_;
              auVar171._24_4_ = auVar177._24_4_ * auVar177._24_4_ + auVar172._24_4_;
              auVar171._28_4_ = auVar177._28_4_ + auVar172._28_4_;
              uVar35 = uVar35 + 8;
              auVar152 = ZEXT3264(auVar171);
            } while ((uVar24 + 8 & 0x1fffffff8) != uVar35);
            auVar58 = vorps_avx(auVar51,auVar119);
            auVar71._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
            auVar71._12_4_ = auVar80._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar71,auVar58);
            auVar52 = vpackssdw_avx(auVar58,auVar53);
            auVar58 = vorps_avx(auVar51,auVar119);
            auVar115._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
            auVar115._8_4_ = auVar81._8_4_;
            auVar115._12_4_ = auVar81._12_4_ ^ 0x80000000;
            auVar58 = vpcmpgtq_avx(auVar115,auVar58);
            auVar58 = vpackssdw_avx(auVar58,auVar126);
            auVar58 = vblendvps_avx(auVar172._0_16_,auVar169,auVar58 ^ auVar120);
            in_ZMM2 = ZEXT1664(auVar171._16_16_);
            auVar52 = vblendvps_avx(auVar172._16_16_,auVar171._16_16_,auVar52 ^ auVar120);
            auVar58 = vhaddps_avx(auVar52,auVar58);
            auVar58 = vhaddps_avx(auVar58,auVar58);
            auVar58 = vhaddps_avx(auVar58,auVar58);
            auVar152 = ZEXT1664(auVar58);
          }
          fVar154 = auVar152._0_4_;
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar36);
      }
      if (0 < (int)uVar18) {
        auVar46 = ZEXT416((uint)(fVar154 * fVar141 + (this->super_GroupNorm).eps));
        auVar46 = vsqrtss_avx(auVar46,auVar46);
        fVar154 = 1.0 / auVar46._0_4_;
        fVar142 = fVar154 * -fVar142;
        uVar33 = 0;
        do {
          fVar155 = fVar142;
          fVar156 = fVar154;
          if ((this->super_GroupNorm).affine != 0) {
            fVar156 = fVar154 * *pfVar26;
            fVar155 = fVar142 * *pfVar26 + *pfVar31;
          }
          pauVar29 = (undefined1 (*) [32])((long)pvVar1 + uVar17 * uVar32 * uVar33 + lVar30);
          auVar46 = vshufps_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar156),0);
          auVar58 = vshufps_avx(ZEXT416((uint)fVar155),ZEXT416((uint)fVar155),0);
          fVar156 = auVar58._0_4_;
          fVar157 = auVar58._4_4_;
          fVar158 = auVar58._8_4_;
          fVar159 = auVar58._12_4_;
          fVar160 = auVar46._0_4_;
          fVar161 = auVar46._4_4_;
          fVar135 = auVar46._8_4_;
          fVar155 = auVar46._12_4_;
          uVar21 = 0;
          if (7 < (int)uVar19) {
            iVar20 = 7;
            do {
              auVar117._0_4_ = fVar160 * *(float *)*pauVar29 + fVar156;
              auVar117._4_4_ = fVar161 * *(float *)(*pauVar29 + 4) + fVar157;
              auVar117._8_4_ = fVar135 * *(float *)(*pauVar29 + 8) + fVar158;
              auVar117._12_4_ = fVar155 * *(float *)(*pauVar29 + 0xc) + fVar159;
              auVar117._16_4_ = fVar160 * *(float *)(*pauVar29 + 0x10) + fVar156;
              auVar117._20_4_ = fVar161 * *(float *)(*pauVar29 + 0x14) + fVar157;
              auVar117._24_4_ = fVar135 * *(float *)(*pauVar29 + 0x18) + fVar158;
              auVar117._28_4_ = in_ZMM2._28_4_ + fVar159;
              in_ZMM2 = ZEXT3264(auVar117);
              *pauVar29 = auVar117;
              pauVar29 = pauVar29 + 1;
              iVar20 = iVar20 + 8;
              uVar21 = uVar28;
            } while (iVar20 < (int)uVar19);
          }
          uVar23 = uVar21 | 3;
          while ((int)uVar23 < (int)uVar19) {
            fVar140 = *(float *)(*pauVar29 + 4);
            fVar143 = *(float *)(*pauVar29 + 8);
            fVar144 = *(float *)(*pauVar29 + 0xc);
            *(float *)*pauVar29 = fVar156 + fVar160 * *(float *)*pauVar29;
            *(float *)(*pauVar29 + 4) = fVar157 + fVar161 * fVar140;
            *(float *)(*pauVar29 + 8) = fVar158 + fVar135 * fVar143;
            *(float *)(*pauVar29 + 0xc) = fVar159 + fVar155 * fVar144;
            pauVar29 = (undefined1 (*) [32])(*pauVar29 + 0x10);
            uVar23 = uVar21 + 7;
            uVar21 = uVar21 + 4;
          }
          if ((int)uVar21 < (int)uVar19) {
            uVar24 = CONCAT44(0,~uVar21 + uVar19);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = uVar24;
            auVar52 = vpshufd_avx(auVar72,0x44);
            auVar46 = vorps_avx(auVar52,auVar119);
            auVar58 = vorps_avx(auVar52,auVar119);
            uVar35 = 0;
            do {
              auVar73._8_8_ = 0;
              auVar73._0_8_ = uVar35;
              auVar50 = vpshufd_avx(auVar73,0x44);
              auVar87._16_16_ = auVar50;
              auVar87._0_16_ = auVar50;
              auVar81 = vorps_avx(auVar87,auVar15);
              auVar80 = vorps_avx(auVar87,auVar16);
              auVar50 = vorps_avx(auVar52,auVar119);
              auVar133._0_8_ = auVar80._16_8_ ^ 0x8000000000000000;
              auVar133._8_4_ = auVar80._24_4_;
              auVar133._12_4_ = auVar80._28_4_ ^ 0x80000000;
              auVar51 = vpcmpgtq_avx(auVar133,auVar50);
              auVar74._0_8_ = auVar80._0_8_ ^ 0x8000000000000000;
              auVar74._8_4_ = auVar80._8_4_;
              auVar74._12_4_ = auVar80._12_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar74,auVar46);
              auVar51 = vpackssdw_avx(auVar109,auVar51);
              auVar134._0_8_ = auVar81._16_8_ ^ 0x8000000000000000;
              auVar134._8_4_ = auVar81._24_4_;
              auVar134._12_4_ = auVar81._28_4_ ^ 0x80000000;
              auVar50 = vpcmpgtq_avx(auVar134,auVar50);
              in_ZMM2 = ZEXT1664(auVar50);
              auVar97._0_8_ = auVar81._0_8_ ^ 0x8000000000000000;
              auVar97._8_4_ = auVar81._8_4_;
              auVar97._12_4_ = auVar81._12_4_ ^ 0x80000000;
              auVar109 = vpcmpgtq_avx(auVar97,auVar58);
              auVar50 = vpackssdw_avx(auVar109,auVar50);
              auVar50 = vpackssdw_avx(auVar50 ^ auVar120,auVar51 ^ auVar120);
              auVar51 = vpmovsxwd_avx(auVar50);
              auVar50 = vpunpckhwd_avx(auVar50,auVar50);
              auVar88._16_16_ = auVar50;
              auVar88._0_16_ = auVar51;
              auVar81 = vmaskmovps_avx(auVar88,*(undefined1 (*) [32])(*pauVar29 + uVar35 * 4));
              auVar104._0_4_ = fVar156 + fVar160 * auVar81._0_4_;
              auVar104._4_4_ = fVar157 + fVar161 * auVar81._4_4_;
              auVar104._8_4_ = fVar158 + fVar135 * auVar81._8_4_;
              auVar104._12_4_ = fVar159 + fVar155 * auVar81._12_4_;
              auVar104._16_4_ = fVar156 + fVar160 * auVar81._16_4_;
              auVar104._20_4_ = fVar157 + fVar161 * auVar81._20_4_;
              auVar104._24_4_ = fVar158 + fVar135 * auVar81._24_4_;
              auVar104._28_4_ = fVar159 + auVar81._28_4_;
              auVar81 = vmaskmovps_avx(auVar88,auVar104);
              *(undefined1 (*) [32])(*pauVar29 + uVar35 * 4) = auVar81;
              uVar35 = uVar35 + 8;
            } while ((uVar24 + 8 & 0x1fffffff8) != uVar35);
          }
          pfVar26 = pfVar26 + 1;
          pfVar31 = pfVar31 + 1;
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar36);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (this->super_GroupNorm).group);
  }
  return 0;
}

Assistant:

int GroupNorm_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    const int dims = bottom_top_blob.dims;
    const int channels_per_group = channels / group;

    if (dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < channels_per_group; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < channels_per_group; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < channels_per_group; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / channels_per_group;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / channels_per_group + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                int i = 0;
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _gamma = _mm512_loadu_ps(gamma);
                    __m512 _beta = _mm512_loadu_ps(beta);
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _a = _mm512_mul_ps(_gamma, _scale1_avx512);
                    __m512 _b = _mm512_add_ps(_mm512_mul_ps(_gamma, _scale2_avx512), _beta);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a), _b);
                    _mm512_storeu_ps(ptr, _p);
                    gamma += 16;
                    beta += 16;
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _gamma = _mm256_loadu_ps(gamma);
                    __m256 _beta = _mm256_loadu_ps(beta);
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _a = _mm256_mul_ps(_gamma, _scale1_avx);
                    __m256 _b = _mm256_comp_fmadd_ps(_gamma, _scale2_avx, _beta);
                    _p = _mm256_comp_fmadd_ps(_p, _a, _b);
                    _mm256_storeu_ps(ptr, _p);
                    gamma += 8;
                    beta += 8;
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _gamma = _mm_loadu_ps(gamma);
                    __m128 _beta = _mm_loadu_ps(beta);
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _a = _mm_mul_ps(_gamma, _scale1);
                    __m128 _b = _mm_comp_fmadd_ps(_gamma, _scale2, _beta);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    gamma += 4;
                    beta += 4;
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    *ptr = *ptr * a + b;
                    gamma++;
                    beta++;
                    ptr++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < channels_per_group; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < channels_per_group; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < channels_per_group; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < channels_per_group; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 2)
    {
        int w = bottom_top_blob.w;
        int size = channels_per_group * w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.row_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            float* ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / size;

            float sqsum = 0.f;
            ptr = bottom_top_blob_g;
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / size + eps);
            float scale2 = -mean * scale1;

            ptr = bottom_top_blob_g;
            if (affine)
            {
                const float* gamma = gamma_data_g;
                const float* beta = beta_data_g;
                for (int q = 0; q < channels_per_group; q++)
                {
                    float a = *gamma * scale1;
                    float b = *gamma * scale2 + *beta;
                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _a_avx512 = _mm512_set1_ps(a);
                    __m512 _b_avx512 = _mm512_set1_ps(b);
                    for (; i + 15 < w; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                        _mm512_storeu_ps(ptr, _p);
                        ptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _a_avx = _mm256_set1_ps(a);
                    __m256 _b_avx = _mm256_set1_ps(b);
                    for (; i + 7 < w; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                        _mm256_storeu_ps(ptr, _p);
                        ptr += 8;
                    }
#endif // __AVX__
                    __m128 _a = _mm_set1_ps(a);
                    __m128 _b = _mm_set1_ps(b);
                    for (; i + 3 < w; i += 4)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_comp_fmadd_ps(_p, _a, _b);
                        _mm_storeu_ps(ptr, _p);
                        ptr += 4;
                    }
#endif // __SSE2__
                    for (; i < w; i++)
                    {
                        *ptr = *ptr * a + b;
                        ptr++;
                    }
                    gamma++;
                    beta++;
                }
            }
            else
            {
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _scale1_avx512 = _mm512_set1_ps(scale1);
                __m512 _scale2_avx512 = _mm512_set1_ps(scale2);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _scale1_avx512), _scale2_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _scale1_avx = _mm256_set1_ps(scale1);
                __m256 _scale2_avx = _mm256_set1_ps(scale2);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _scale1_avx, _scale2_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _scale1 = _mm_set1_ps(scale1);
                __m128 _scale2 = _mm_set1_ps(scale2);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _scale1, _scale2);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * scale1 + scale2;
                    ptr++;
                }
            }
        }

        return 0;
    }

    if (dims == 3 || dims == 4)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int d = bottom_top_blob.d;
        int size = w * h * d;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            Mat bottom_top_blob_g = bottom_top_blob.channel_range(g * channels_per_group, channels_per_group);
            const Mat gamma_data_g = gamma_data.range(g * channels_per_group, channels_per_group);
            const Mat beta_data_g = beta_data.range(g * channels_per_group, channels_per_group);

            // mean and var
            float sum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sum_avx512 = _mm512_setzero_ps();
                for (; i + 15 < size; i += 16)
                {
                    _sum_avx512 = _mm512_add_ps(_sum_avx512, _mm512_loadu_ps(ptr));
                    ptr += 16;
                }
                sum += _mm512_comp_reduce_add_ps(_sum_avx512);
#endif // __AVX512F__
                __m256 _sum_avx = _mm256_setzero_ps();
                for (; i + 7 < size; i += 8)
                {
                    _sum_avx = _mm256_add_ps(_sum_avx, _mm256_loadu_ps(ptr));
                    ptr += 8;
                }
                sum += _mm256_reduce_add_ps(_sum_avx);
#endif // __AVX__
                __m128 _sum = _mm_setzero_ps();
                for (; i + 3 < size; i += 4)
                {
                    _sum = _mm_add_ps(_sum, _mm_loadu_ps(ptr));
                    ptr += 4;
                }
                sum += _mm_reduce_add_ps(_sum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    sum += *ptr;
                    ptr++;
                }
            }

            float mean = sum / (channels_per_group * size);

            float sqsum = 0.f;
            for (int q = 0; q < channels_per_group; q++)
            {
                const float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _sqsum_avx512 = _mm512_setzero_ps();
                __m512 _mean_avx512 = _mm512_set1_ps(mean);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_sub_ps(_p, _mean_avx512);
                    _p = _mm512_mul_ps(_p, _p);
                    _sqsum_avx512 = _mm512_add_ps(_p, _sqsum_avx512);
                    ptr += 16;
                }
                sqsum += _mm512_comp_reduce_add_ps(_sqsum_avx512);
#endif // __AVX512F__
                __m256 _sqsum_avx = _mm256_setzero_ps();
                __m256 _mean_avx = _mm256_set1_ps(mean);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_sub_ps(_p, _mean_avx);
                    _sqsum_avx = _mm256_comp_fmadd_ps(_p, _p, _sqsum_avx);
                    ptr += 8;
                }
                sqsum += _mm256_reduce_add_ps(_sqsum_avx);
#endif // __AVX__
                __m128 _sqsum = _mm_setzero_ps();
                __m128 _mean = _mm_set1_ps(mean);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_sub_ps(_p, _mean);
                    _sqsum = _mm_comp_fmadd_ps(_p, _p, _sqsum);
                    ptr += 4;
                }
                sqsum += _mm_reduce_add_ps(_sqsum);
#endif // __SSE2__
                for (; i < size; i++)
                {
                    float tmp = *ptr - mean;
                    sqsum += tmp * tmp;
                    ptr++;
                }
            }

            float scale1 = 1.f / sqrtf(sqsum / (channels_per_group * size) + eps);
            float scale2 = -mean * scale1;

            const float* gamma = gamma_data_g;
            const float* beta = beta_data_g;
            for (int q = 0; q < channels_per_group; q++)
            {
                float a = scale1;
                float b = scale2;
                if (affine)
                {
                    a = *gamma * a;
                    b = *gamma * b + *beta;
                }

                float* ptr = bottom_top_blob_g.channel(q);
                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _a_avx512 = _mm512_set1_ps(a);
                __m512 _b_avx512 = _mm512_set1_ps(b);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    _p = _mm512_add_ps(_mm512_mul_ps(_p, _a_avx512), _b_avx512);
                    _mm512_storeu_ps(ptr, _p);
                    ptr += 16;
                }
#endif // __AVX512F__
                __m256 _a_avx = _mm256_set1_ps(a);
                __m256 _b_avx = _mm256_set1_ps(b);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _a_avx, _b_avx);
                    _mm256_storeu_ps(ptr, _p);
                    ptr += 8;
                }
#endif // __AVX__
                __m128 _a = _mm_set1_ps(a);
                __m128 _b = _mm_set1_ps(b);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _p = _mm_comp_fmadd_ps(_p, _a, _b);
                    _mm_storeu_ps(ptr, _p);
                    ptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *ptr = *ptr * a + b;
                    ptr++;
                }

                gamma++;
                beta++;
            }
        }

        return 0;
    }

    return 0;
}